

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O0

void __thiscall stock::get(stock *this)

{
  bool bVar1;
  int iVar2;
  char *__nptr;
  void *pvVar3;
  value_type *__x;
  long in_RDI;
  const_iterator e;
  const_iterator p;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff58;
  vector<std::shared_ptr<cppcms::http::context>,_std::allocator<std::shared_ptr<cppcms::http::context>_>_>
  *this_00;
  vector<std::shared_ptr<cppcms::http::context>,_std::allocator<std::shared_ptr<cppcms::http::context>_>_>
  local_70;
  _Self local_50 [3];
  allocator local_31;
  string local_30 [32];
  _Self local_10 [2];
  
  cppcms::application::response();
  cppcms::http::response::set_plain_text_header();
  cppcms::application::request();
  cppcms::http::request::get_abi_cxx11_();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"from",&local_31);
  local_10[0]._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_ffffffffffffff58,(key_type *)0x132866);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cppcms::application::request();
  cppcms::http::request::get_abi_cxx11_();
  local_50[0]._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_ffffffffffffff58);
  bVar1 = std::operator==(local_10,local_50);
  if (!bVar1) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1328d0);
    __nptr = (char *)std::__cxx11::string::c_str();
    iVar2 = atoi(__nptr);
    if (*(int *)(in_RDI + 0x28) <= iVar2) {
      __x = (value_type *)(in_RDI + 0x38);
      this_00 = &local_70;
      cppcms::application::release_context();
      std::
      vector<std::shared_ptr<cppcms::http::context>,_std::allocator<std::shared_ptr<cppcms::http::context>_>_>
      ::push_back(this_00,__x);
      std::shared_ptr<cppcms::http::context>::~shared_ptr
                ((shared_ptr<cppcms::http::context> *)0x1329e3);
      return;
    }
  }
  cppcms::application::response();
  pvVar3 = (void *)cppcms::http::response::out();
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,*(double *)(in_RDI + 0x30));
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  cppcms::application::release_context();
  std::__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x132943);
  cppcms::http::context::async_complete_response();
  std::shared_ptr<cppcms::http::context>::~shared_ptr((shared_ptr<cppcms::http::context> *)0x132957)
  ;
  return;
}

Assistant:

void get()
	{
		response().set_plain_text_header();
		cppcms::http::request::form_type::const_iterator p=request().get().find("from"),
			e=request().get().end();
		if(p==e || atoi(p->second.c_str()) < counter_) {
			response().out() << price_<<std::endl;
			release_context()->async_complete_response();
			return;
		}
		all_.push_back(release_context());
	}